

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_testall_(MPIABI_Fint *count,MPIABI_Fint *array_of_requests,int *flag,
                    MPIABI_Fint *array_of_statuses,MPIABI_Fint *ierror)

{
  mpi_testall_();
  return;
}

Assistant:

void mpiabi_testall_(
  const MPIABI_Fint * count,
  MPIABI_Fint * array_of_requests,
  int * flag,
  MPIABI_Fint * array_of_statuses,
  MPIABI_Fint * ierror
) {
  return mpi_testall_(
    count,
    array_of_requests,
    flag,
    array_of_statuses,
    ierror
  );
}